

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O1

void IOcontroller::write_result(string *outFileName,TResult *resultObj,string *outFolder)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  size_t sVar8;
  pointer pcVar9;
  char cVar10;
  ostream *poVar11;
  long *plVar12;
  long *plVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream outFileNew;
  long *local_278 [2];
  long local_268 [2];
  size_t local_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  dVar1 = resultObj->__Approx;
  dVar2 = resultObj->__RunningTime;
  dVar3 = resultObj->__Influence;
  dVar4 = resultObj->__InfluenceOriginal;
  iVar7 = resultObj->__SeedSize;
  sVar8 = resultObj->__RRsetsSize;
  dVar5 = resultObj->__BoundMin_inf;
  dVar6 = resultObj->__BoundMin_inf_cost;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   --------------------",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |Approx.: ",0xc);
  poVar11 = std::ostream::_M_insert<double>(dVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |Time (sec): ",0xf);
  poVar11 = std::ostream::_M_insert<double>(dVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |Influence: ",0xe);
  poVar11 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  |Self-estimated influence: ",0x1d);
  poVar11 = std::ostream::_M_insert<double>(dVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |#Seeds: ",0xb);
  plVar12 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |#RR sets: ",0xd);
  local_258 = sVar8;
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  |BoundMin Influence: ",0x17);
  poVar11 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  |BoundMinCost Influence: ",0x1b);
  poVar11 = std::ostream::_M_insert<double>(dVar6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   --------------------",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  mkdir((outFolder->_M_dataplus)._M_p,0x1db);
  pcVar9 = (outFolder->_M_dataplus)._M_p;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar9,pcVar9 + outFolder->_M_string_length);
  std::__cxx11::string::append((char *)local_278);
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)local_278,(ulong)(outFileName->_M_dataplus)._M_p);
  plVar13 = plVar12 + 2;
  if ((long *)*plVar12 == plVar13) {
    local_240 = *plVar13;
    lStack_238 = plVar12[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *plVar13;
    local_250 = (long *)*plVar12;
  }
  local_248 = plVar12[1];
  *plVar12 = (long)plVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_250,_S_out);
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  cVar10 = std::__basic_file<char>::is_open();
  if (cVar10 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Approx.: ",9);
    poVar11 = std::ostream::_M_insert<double>(dVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Time (sec): ",0xc);
    poVar11 = std::ostream::_M_insert<double>(dVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Influence: ",0xb);
    poVar11 = std::ostream::_M_insert<double>(dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"Self-estimated influence: ",0x1a);
    poVar11 = std::ostream::_M_insert<double>(dVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#Seeds: ",8);
    plVar12 = (long *)std::ostream::operator<<((ostream *)&local_230,iVar7);
    std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
    std::ostream::put((char)plVar12);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#RR sets: ",10);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"BoundMin Influence: ",0x14);
    poVar11 = std::ostream::_M_insert<double>(dVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"BoundMinCost Influence: ",0x18);
    poVar11 = std::ostream::_M_insert<double>(dVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

static void write_result(const std::string& outFileName, const TResult& resultObj, const std::string& outFolder)
    {
        const auto approx = resultObj.get_approximation();
        const auto runTime = resultObj.get_running_time();
        const auto influence = resultObj.get_influence();
        const auto influenceOriginal = resultObj.get_influence_original();
        const auto seedSize = resultObj.get_seed_size();
        const auto RRsetsSize = resultObj.get_RRsets_size();
        const auto Boundmin_influence = resultObj.get_boundmin_inf();
        const auto Boundmin_cost_influence = resultObj.get_boundmin_inf_cost();

        std::cout << "   --------------------" << std::endl;
        std::cout << "  |Approx.: " << approx << std::endl;
        std::cout << "  |Time (sec): " << runTime << std::endl;
        std::cout << "  |Influence: " << influence << std::endl;
        std::cout << "  |Self-estimated influence: " << influenceOriginal << std::endl;
        std::cout << "  |#Seeds: " << seedSize << std::endl;
        std::cout << "  |#RR sets: " << RRsetsSize << std::endl;
        std::cout << "  |BoundMin Influence: " << Boundmin_influence << std::endl;
        std::cout << "  |BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
        std::cout << "   --------------------" << std::endl;
        mkdir_absence(outFolder.c_str());
        std::ofstream outFileNew(outFolder + "/" + outFileName);
        if (outFileNew.is_open())
        {
            outFileNew << "Approx.: " << approx << std::endl;
            outFileNew << "Time (sec): " << runTime << std::endl;
            outFileNew << "Influence: " << influence << std::endl;
            outFileNew << "Self-estimated influence: " << influenceOriginal << std::endl;
            outFileNew << "#Seeds: " << seedSize << std::endl;
            outFileNew << "#RR sets: " << RRsetsSize << std::endl;
            outFileNew << "BoundMin Influence: " << Boundmin_influence << std::endl;
            outFileNew << "BoundMinCost Influence: " << Boundmin_cost_influence << std::endl;
            outFileNew.close();
        }
    }